

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_NtkWriteNodeInt(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover)

{
  int *pnVars;
  uint nInputs;
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  word wVar3;
  int *piVar4;
  char *pcVar5;
  ushort uVar6;
  long lVar7;
  word *pwVar8;
  char cVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  bool bVar13;
  int nVarsMin [2];
  word Cofs6 [2];
  word uTruth7 [2];
  word Cofs7 [2] [2];
  int pVars [2] [10];
  int local_f8 [2];
  FILE *local_f0;
  word local_e8 [2];
  long local_d8;
  Vec_Int_t *local_d0;
  ulong local_c8;
  ulong local_c0;
  word local_b8 [4];
  word local_98 [2];
  int local_88 [10];
  int local_60 [12];
  
  nInputs = (pNode->vFanins).nSize;
  local_d0 = vCover;
  if (7 < (int)nInputs) {
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    printf("Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n",pcVar2);
    return;
  }
  fputc(10,(FILE *)pFile);
  if (4 < (int)nInputs) {
    lVar10 = (long)(pNode->vFanins).nSize;
    if (0 < lVar10) {
      lVar7 = 0;
      do {
        local_60[lVar7] = (int)lVar7;
        local_88[lVar7] = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
    }
    if (nInputs == 7) {
      Abc_SopToTruth7((char *)(pNode->field_5).pData,7,local_b8);
      uVar1 = If_Dec7PickBestMux(local_b8,local_b8 + 2,local_b8 + 4);
      wVar3 = 0;
    }
    else {
      wVar3 = Abc_SopToTruth((char *)(pNode->field_5).pData,nInputs);
      uVar1 = If_Dec6PickBestMux(wVar3,local_e8);
    }
    if ((int)uVar1 < 0) {
      if ((nInputs & 0x7ffffffe) != 6) {
        __assert_fail("nVars == 6 || nVars == 7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                      ,0x390,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
      }
      if (nInputs == 7) {
        local_c0 = If_Dec7Perform(local_b8,1);
      }
      else {
        local_c0 = If_Dec6Perform(wVar3,1);
      }
      if (local_c0 == 0) {
        pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar2);
      }
      else {
        local_c8 = local_c0 >> 0x20;
        lVar10 = 1;
        cVar9 = '0';
        piVar11 = local_60;
        local_f0 = (FILE *)pFile;
        do {
          uVar6 = (ushort)local_c8;
          if (lVar10 == 0) {
            uVar6 = (ushort)local_c0;
          }
          local_b8[lVar10] = (ulong)uVar6 * 0x1000100010001;
          lVar7 = 0;
          do {
            *(uint *)((long)piVar11 + lVar7) = (uint)(local_c0 >> ((char)lVar7 + cVar9 & 0x3fU)) & 7
            ;
            lVar7 = lVar7 + 4;
          } while (lVar7 != 0x10);
          pnVars = local_f8 + lVar10;
          wVar3 = If_Dec6MinimumBase((ulong)uVar6 * 0x1000100010001,local_88 + lVar10 * 10,4,pnVars)
          ;
          local_d8 = lVar10;
          local_e8[lVar10] = wVar3;
          fwrite(".names",6,1,local_f0);
          if (0 < *pnVars) {
            lVar10 = 0;
            do {
              if ((long)piVar11[lVar10] == 7) {
                piVar4 = (pNode->vFanouts).pArray;
                pcVar2 = " %s_cascade";
              }
              else {
                piVar4 = (pNode->vFanins).pArray + piVar11[lVar10];
                pcVar2 = " %s";
              }
              pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar4]);
              fprintf(local_f0,pcVar2,pcVar5);
              lVar10 = lVar10 + 1;
            } while (lVar10 < *pnVars);
          }
          pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          lVar7 = local_d8;
          __stream = local_f0;
          lVar10 = local_d8 + -1;
          pcVar5 = "";
          if (local_d8 == 0) {
            pcVar5 = "_cascade";
          }
          fprintf(local_f0," %s%s\n",pcVar2,pcVar5);
          pcVar2 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,local_e8[lVar7],
                                   local_f8[lVar7],local_d0);
          fputs(pcVar2,__stream);
          cVar9 = cVar9 + -0x20;
          piVar11 = piVar11 + -10;
        } while (lVar7 != 0);
      }
    }
    else {
      if (nInputs == 7) {
        If_Dec7MinimumBase(local_b8 + 2,local_88,7,local_f8);
        If_Dec7MinimumBase(local_b8 + 4,local_60,7,local_f8 + 1);
      }
      else {
        local_e8[0] = If_Dec6MinimumBase(local_e8[0],local_88,nInputs,local_f8);
        local_e8[1] = If_Dec6MinimumBase(local_e8[1],local_60,nInputs,local_f8 + 1);
      }
      if (4 < local_f8[0]) {
        __assert_fail("nVarsMin[0] < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                      ,0x37a,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
      }
      local_d8 = CONCAT44(local_d8._4_4_,nInputs);
      if (4 < local_f8[1]) {
        __assert_fail("nVarsMin[1] < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                      ,0x37b,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
      }
      fwrite(".names",6,1,(FILE *)pFile);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar1]]);
      fprintf((FILE *)pFile," %s",pcVar2);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_cascade0",pcVar2);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_cascade1",pcVar2);
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s\n",pcVar2);
      fwrite("1-1 1\n01- 1\n",0xc,1,(FILE *)pFile);
      piVar11 = local_88;
      uVar12 = 0;
      do {
        pwVar8 = local_e8 + uVar12;
        if ((int)local_d8 == 7) {
          pwVar8 = local_b8 + uVar12 * 2 + 2;
        }
        local_f0 = (FILE *)Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,*pwVar8,
                                           local_f8[uVar12],local_d0);
        fwrite(".names",6,1,(FILE *)pFile);
        if (0 < local_f8[uVar12]) {
          lVar10 = 0;
          do {
            pcVar2 = Abc_ObjName((Abc_Obj_t *)
                                 pNode->pNtk->vObjs->pArray
                                 [(pNode->vFanins).pArray[piVar11[lVar10]]]);
            fprintf((FILE *)pFile," %s",pcVar2);
            lVar10 = lVar10 + 1;
          } while (lVar10 < local_f8[uVar12]);
        }
        pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
        fprintf((FILE *)pFile," %s_cascade%d\n",pcVar2,uVar12 & 0xffffffff);
        fputs((char *)local_f0,(FILE *)pFile);
        piVar11 = piVar11 + 10;
        bVar13 = uVar12 == 0;
        uVar12 = uVar12 + 1;
      } while (bVar13);
    }
    return;
  }
  fwrite(".names",6,1,(FILE *)pFile);
  if (0 < (pNode->vFanins).nSize) {
    lVar10 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar10]])
      ;
      fprintf((FILE *)pFile," %s",pcVar2);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (pNode->vFanins).nSize);
  }
  pcVar2 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  fprintf((FILE *)pFile," %s\n",pcVar2);
  fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
  return;
}

Assistant:

void Io_NtkWriteNodeInt( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNet;
    int i, nVars = Abc_ObjFaninNum(pNode);
    if ( nVars > 7 )
    {
        printf( "Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return;
    }

    fprintf( pFile, "\n" );
    if ( nVars <= 4 )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
    }
    else
    {
        extern int  If_Dec6PickBestMux( word t, word Cofs[2] );
        extern int  If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] );
        extern word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars );
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        extern word If_Dec6Perform( word t, int fDerive );
        extern word If_Dec7Perform( word t[2], int fDerive );

        char * pSop;
        word z, uTruth6 = 0, uTruth7[2], Cofs6[2], Cofs7[2][2];
        int c, iVar, nVarsMin[2], pVars[2][10];

        // collect variables
        Abc_ObjForEachFanin( pNode, pNet, i )
            pVars[0][i] = pVars[1][i] = i;

        // derive truth table
        if ( nVars == 7 )
        {
            Abc_SopToTruth7( (char*)Abc_ObjData(pNode), nVars, uTruth7 );
            iVar = If_Dec7PickBestMux( uTruth7, Cofs7[0], Cofs7[1] );
        }
        else
        {
            uTruth6 = Abc_SopToTruth( (char*)Abc_ObjData(pNode), nVars );
            iVar = If_Dec6PickBestMux( uTruth6, Cofs6 );
        }

        // perform MUX decomposition
        if ( iVar >= 0 )
        {
            if ( nVars == 7 )
            {
                If_Dec7MinimumBase( Cofs7[0], pVars[0], nVars, &nVarsMin[0] );
                If_Dec7MinimumBase( Cofs7[1], pVars[1], nVars, &nVarsMin[1] );
            }
            else
            {
                Cofs6[0] = If_Dec6MinimumBase( Cofs6[0], pVars[0], nVars, &nVarsMin[0] );
                Cofs6[1] = If_Dec6MinimumBase( Cofs6[1], pVars[1], nVars, &nVarsMin[1] );
            }
            assert( nVarsMin[0] < 5 );
            assert( nVarsMin[1] < 5 );
            // write MUX
            fprintf( pFile, ".names" );
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,iVar)) );
            fprintf( pFile, " %s_cascade0", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s_cascade1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, "1-1 1\n01- 1\n" );
            // write cofactors
            for ( c = 0; c < 2; c++ )
            {
                pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                    (word)(nVars == 7 ? Cofs7[c][0] : Cofs6[c]), nVarsMin[c], vCover );
                fprintf( pFile, ".names" );
                for ( i = 0; i < nVarsMin[c]; i++ )
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
                fprintf( pFile, " %s_cascade%d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c );
                fprintf( pFile, "%s", pSop );
            }
            return;
        }
        assert( nVars == 6 || nVars == 7 );

        // try cascade decomposition
        if ( nVars == 7 )
        {
            z = If_Dec7Perform( uTruth7, 1 );
            //If_Dec7Verify( uTruth7, z );
        }
        else
        {
            z = If_Dec6Perform( uTruth6, 1 );
            //If_Dec6Verify( uTruth6, z );
        }
        if ( z == 0 )
        {
            printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            return;
        }

        // derive nodes
        for ( c = 1; c >= 0; c-- )
        {
            // collect fanins
            uTruth7[c]  = ((c ? z >> 32 : z) & 0xffff);
            uTruth7[c] |= (uTruth7[c] << 16);
            uTruth7[c] |= (uTruth7[c] << 32);
            for ( i = 0; i < 4; i++ )
                pVars[c][i] = (z >> (c*32+16+4*i)) & 7;

            // minimize truth table
            Cofs6[c] = If_Dec6MinimumBase( uTruth7[c], pVars[c], 4, &nVarsMin[c] );

            // write the nodes
            fprintf( pFile, ".names" );
            for ( i = 0; i < nVarsMin[c]; i++ )
                if ( pVars[c][i] == 7 )
                    fprintf( pFile, " %s_cascade", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
            fprintf( pFile, " %s%s\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c? "" : "_cascade" );

            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                (word)Cofs6[c], nVarsMin[c], vCover );
            fprintf( pFile, "%s", pSop );
        }
    }
}